

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

void Extra_Truth4VarN(unsigned_short **puCanons,char ***puPhases,char **ppCounters,int nPhasesMax)

{
  char cVar1;
  char *pcVar2;
  int v;
  unsigned_short *__s;
  char *__s_00;
  char **__ptr;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  __s = (unsigned_short *)malloc(0x20000);
  uVar8 = 0;
  memset(__s,0,0x20000);
  __s_00 = (char *)malloc(0x10000);
  memset(__s_00,0,0x10000);
  __ptr = (char **)Extra_ArrayAlloc(0x10000,nPhasesMax,1);
  do {
    if ((ulong)__s[uVar8] == 0) {
      uVar5 = 0;
      do {
        puVar6 = Extra_TruthPolarize::Signs;
        lVar3 = 0;
        uVar7 = uVar8 & 0xffffffff;
        do {
          if ((uVar5 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
            bVar4 = (byte)(1 << ((byte)lVar3 & 0x1f));
            uVar7 = (ulong)((*puVar6 & (uint)uVar7) >> (bVar4 & 0x1f) |
                           (~*puVar6 & (uint)uVar7) << (bVar4 & 0x1f));
          }
          lVar3 = lVar3 + 1;
          puVar6 = puVar6 + 1;
        } while (lVar3 != 4);
        if (((ulong)__s[uVar7] == 0) && (uVar8 != 0 || uVar5 == 0)) {
          __s[uVar7] = (unsigned_short)uVar8;
          *__ptr[uVar7] = (char)uVar5;
          __s_00[uVar7] = '\x01';
        }
        else {
          if (uVar8 != __s[uVar7]) {
            __assert_fail("uCanons[uPhase] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                          ,0x351,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)")
            ;
          }
          cVar1 = __s_00[uVar7];
          if (cVar1 < nPhasesMax) {
            pcVar2 = __ptr[uVar7];
            __s_00[uVar7] = cVar1 + '\x01';
            pcVar2[(int)cVar1] = (char)uVar5;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x10);
    }
    else if (uVar8 <= __s[uVar8]) {
      __assert_fail("uTruth > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x342,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)");
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x10000);
  if (puCanons == (unsigned_short **)0x0) {
    if (__s != (unsigned_short *)0x0) {
      free(__s);
    }
  }
  else {
    *puCanons = __s;
  }
  if (puPhases == (char ***)0x0) {
    if (__ptr != (char **)0x0) {
      free(__ptr);
    }
  }
  else {
    *puPhases = __ptr;
  }
  if (ppCounters == (char **)0x0) {
    if (__s_00 != (char *)0x0) {
      free(__s_00);
      return;
    }
  }
  else {
    *ppCounters = __s_00;
  }
  return;
}

Assistant:

void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int nPhasesMax )
{
    unsigned short * uCanons;
    unsigned uTruth, uPhase;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 4N-classes = %d.\n", nClasses );
}